

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ElabSystemTaskSymbol::reportStaticAssert
          (ElabSystemTaskSymbol *this,Scope *scope,SourceLocation loc,string_view message,
          Expression *condition)

{
  int *piVar1;
  ConstantValue *arg;
  ConstantValue *arg_00;
  bool bVar2;
  Diagnostic *pDVar3;
  int *piVar4;
  SourceLocation noteLocation;
  int *piVar5;
  string_view arg_01;
  Token opToken;
  string local_58;
  
  piVar5 = (int *)message._M_str;
  if (((piVar5 != (int *)0x0) && (*(ConstantValue **)(piVar5 + 4) != (ConstantValue *)0x0)) &&
     (bVar2 = ConstantValue::isTrue(*(ConstantValue **)(piVar5 + 4)), bVar2)) {
    return;
  }
  pDVar3 = Scope::addDiag((Scope *)this,(DiagCode)0xc10006,(SourceLocation)scope);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,message._M_len,(long)loc + message._M_len);
  pDVar3 = Diagnostic::addStringAllowEmpty(pDVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (((piVar5 != (int *)0x0) && (*piVar5 == 0xb)) && (piVar5[0x10] - 9U < 10)) {
    piVar4 = piVar5 + 6;
    do {
      piVar1 = *(int **)piVar4;
      piVar4 = piVar1 + 10;
    } while (*piVar1 == 0x167);
    local_58._M_dataplus._M_p = *(pointer *)(piVar1 + 8);
    local_58._M_string_length = *(size_type *)(piVar1 + 10);
    arg = *(ConstantValue **)(*(long *)(piVar5 + 0xc) + 0x10);
    arg_00 = *(ConstantValue **)(*(long *)(piVar5 + 0xe) + 0x10);
    noteLocation = parsing::Token::location((Token *)&local_58);
    pDVar3 = Diagnostic::addNote(pDVar3,(DiagCode)0xe60006,noteLocation);
    Diagnostic::operator<<(pDVar3,*(SourceRange *)(piVar5 + 8));
    pDVar3 = Diagnostic::operator<<(pDVar3,arg);
    arg_01 = parsing::Token::rawText((Token *)&local_58);
    pDVar3 = Diagnostic::operator<<(pDVar3,arg_01);
    Diagnostic::operator<<(pDVar3,arg_00);
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::reportStaticAssert(const Scope& scope, SourceLocation loc,
                                              std::string_view message,
                                              const Expression* condition) {
    if (condition && condition->constant) {
        // Issue no diagnostic if the assert condition is true.
        if (condition->constant->isTrue())
            return;
    }

    auto& diag = scope.addDiag(diag::StaticAssert, loc).addStringAllowEmpty(std::string(message));

    // If the condition is a comparison operator, note the value of both
    // sides to provide more info about why the assertion failed.
    if (condition && condition->kind == ExpressionKind::BinaryOp)
        reduceComparison(condition->as<BinaryExpression>(), diag);
}